

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::Print(VirtualMachine *this)

{
  ostream *poVar1;
  element_type *peVar2;
  Variable VVar3;
  Variable var;
  string local_40;
  
  VVar3 = popOpStack(this);
  poVar1 = this->out;
  var._4_4_ = 0;
  var.type = VVar3.type;
  var.field_1.integerValue = VVar3.field_1.integerValue;
  variableToString_abi_cxx11_(&local_40,this,var,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pushOpStack(this,(Variable)ZEXT816(0));
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Print() {
  Variable var = this->popOpStack();
  this->out << this->variableToString(var, true);
  this->pushUndefined();
  this->advance();
}